

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hexenspecialdecs.cpp
# Opt level: O0

int AF_A_LeafCheck(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  AActor *this;
  DObject *this_00;
  int iVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  bool bVar5;
  Angle *local_78;
  bool local_6e;
  bool local_6b;
  TAngle<double> local_68;
  TAngle<double> local_60;
  TAngle<double> local_58;
  DAngle ang;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                  ,0x102,"int AF_A_LeafCheck(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar5 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar5 = true, (param->field_0).field_1.atag != 1)) {
    bVar5 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar5) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                  ,0x102,"int AF_A_LeafCheck(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = (AActor *)(param->field_0).field_1.a;
  local_6b = true;
  if (this != (AActor *)0x0) {
    local_6b = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_6b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                  ,0x102,"int AF_A_LeafCheck(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar5 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar5 = true, param[1].field_0.field_1.atag != 1)) {
      bVar5 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar5) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                    ,0x102,"int AF_A_LeafCheck(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    this_00 = (DObject *)param[1].field_0.field_1.a;
    local_6e = true;
    if (this_00 != (DObject *)0x0) {
      local_6e = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_6e == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                    ,0x102,"int AF_A_LeafCheck(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((numparam < 3) || (param[2].field_0.field_3.Type == 0xff)) {
    ang.Degrees = 0.0;
  }
  else {
    bVar5 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar5 = true, param[2].field_0.field_1.atag != 8)) {
      bVar5 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar5) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                    ,0x102,"int AF_A_LeafCheck(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    ang.Degrees = (double)param[2].field_0.field_1.a;
  }
  this->special1 = this->special1 + 1;
  if (this->special1 < 0x14) {
    pAVar3 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
    pAVar4 = this;
    if (pAVar3 != (AActor *)0x0) {
      pAVar4 = TObjPtr<AActor>::operator->(&this->target);
    }
    local_78 = &(pAVar4->Angles).Yaw;
    TAngle<double>::TAngle(&local_58,local_78);
    iVar2 = FRandom::operator()(&pr_leafcheck);
    if (iVar2 < 0x41) {
      AActor::SetState(this,this->SpawnState + 7,false);
      iVar2 = FRandom::operator()(&pr_leafcheck);
      (this->Vel).Z = (double)iVar2 / 128.0 + 1.0;
      TAngle<double>::TAngle(&local_68,&local_58);
      iVar2 = FRandom::operator()(&pr_leafcheck);
      AActor::Thrust(this,&local_68,(double)iVar2 / 128.0 + 2.0);
      TFlags<ActorFlag,_unsigned_int>::operator|=(&this->flags,MF_MISSILE);
    }
    else {
      dVar1 = (this->Vel).X;
      if ((((dVar1 == 0.0) && (!NAN(dVar1))) && (dVar1 = (this->Vel).Y, dVar1 == 0.0)) &&
         (!NAN(dVar1))) {
        TAngle<double>::TAngle(&local_60,&local_58);
        iVar2 = FRandom::operator()(&pr_leafcheck);
        AActor::Thrust(this,&local_60,(double)iVar2 / 128.0 + 1.0);
      }
    }
  }
  else {
    AActor::SetState(this,(FState *)0x0,false);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LeafCheck)
{
	PARAM_ACTION_PROLOGUE;

	self->special1++;
	if (self->special1 >= 20)
	{
		self->SetState (NULL);
		return 0;
	}
	DAngle ang = self->target ? self->target->Angles.Yaw : self->Angles.Yaw;
	if (pr_leafcheck() > 64)
	{
		if (self->Vel.X == 0 && self->Vel.Y == 0)
		{
			self->Thrust(ang, pr_leafcheck() / 128. + 1);
		}
		return 0;
	}
	self->SetState (self->SpawnState + 7);
	self->Vel.Z = pr_leafcheck() / 128. + 1;
	self->Thrust(ang, pr_leafcheck() / 128. + 2);
	self->flags |= MF_MISSILE;
	return 0;
}